

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

AutomationEventList LoadAutomationEventList(char *fileName)

{
  AutomationEventList AVar1;
  int iVar2;
  FILE *__stream;
  uint uVar3;
  ulong uVar4;
  AutomationEventList list;
  char eventDesc [64];
  char buffer [256];
  
  list.capacity = 0;
  list.count = 0;
  list.events = (AutomationEvent *)0x0;
  list.events = (AutomationEvent *)calloc(0x4000,0x18);
  list.capacity = 0x4000;
  if (fileName == (char *)0x0) {
    TraceLog(3,"AUTOMATION: New empty events list loaded successfully");
  }
  else {
    __stream = fopen(fileName,"rt");
    if (__stream != (FILE *)0x0) {
      uVar3 = 0;
      memset(buffer,0,0x100);
      eventDesc[0x30] = '\0';
      eventDesc[0x31] = '\0';
      eventDesc[0x32] = '\0';
      eventDesc[0x33] = '\0';
      eventDesc[0x34] = '\0';
      eventDesc[0x35] = '\0';
      eventDesc[0x36] = '\0';
      eventDesc[0x37] = '\0';
      eventDesc[0x38] = '\0';
      eventDesc[0x39] = '\0';
      eventDesc[0x3a] = '\0';
      eventDesc[0x3b] = '\0';
      eventDesc[0x3c] = '\0';
      eventDesc[0x3d] = '\0';
      eventDesc[0x3e] = '\0';
      eventDesc[0x3f] = '\0';
      eventDesc[0x20] = '\0';
      eventDesc[0x21] = '\0';
      eventDesc[0x22] = '\0';
      eventDesc[0x23] = '\0';
      eventDesc[0x24] = '\0';
      eventDesc[0x25] = '\0';
      eventDesc[0x26] = '\0';
      eventDesc[0x27] = '\0';
      eventDesc[0x28] = '\0';
      eventDesc[0x29] = '\0';
      eventDesc[0x2a] = '\0';
      eventDesc[0x2b] = '\0';
      eventDesc[0x2c] = '\0';
      eventDesc[0x2d] = '\0';
      eventDesc[0x2e] = '\0';
      eventDesc[0x2f] = '\0';
      eventDesc[0x10] = '\0';
      eventDesc[0x11] = '\0';
      eventDesc[0x12] = '\0';
      eventDesc[0x13] = '\0';
      eventDesc[0x14] = '\0';
      eventDesc[0x15] = '\0';
      eventDesc[0x16] = '\0';
      eventDesc[0x17] = '\0';
      eventDesc[0x18] = '\0';
      eventDesc[0x19] = '\0';
      eventDesc[0x1a] = '\0';
      eventDesc[0x1b] = '\0';
      eventDesc[0x1c] = '\0';
      eventDesc[0x1d] = '\0';
      eventDesc[0x1e] = '\0';
      eventDesc[0x1f] = '\0';
      eventDesc[0] = '\0';
      eventDesc[1] = '\0';
      eventDesc[2] = '\0';
      eventDesc[3] = '\0';
      eventDesc[4] = '\0';
      eventDesc[5] = '\0';
      eventDesc[6] = '\0';
      eventDesc[7] = '\0';
      eventDesc[8] = '\0';
      eventDesc[9] = '\0';
      eventDesc[10] = '\0';
      eventDesc[0xb] = '\0';
      eventDesc[0xc] = '\0';
      eventDesc[0xd] = '\0';
      eventDesc[0xe] = '\0';
      eventDesc[0xf] = '\0';
      fgets(buffer,0x100,__stream);
      iVar2 = feof(__stream);
      if (iVar2 == 0) {
        uVar4 = 0;
        do {
          if (buffer[0] == 'e') {
            __isoc99_sscanf(buffer,"e %d %d %d %d %d %d %[^\n]s",list.events + uVar4,
                            &list.events[uVar4].type,list.events[uVar4].params,
                            list.events[uVar4].params + 1,list.events[uVar4].params + 2,
                            list.events[uVar4].params + 3,eventDesc);
            uVar4 = (ulong)((int)uVar4 + 1);
          }
          else if (buffer[0] == 'c') {
            __isoc99_sscanf(buffer,"c %i",&list.count);
          }
          uVar3 = (uint)uVar4;
          fgets(buffer,0x100,__stream);
          iVar2 = feof(__stream);
        } while (iVar2 == 0);
      }
      if (uVar3 != list.count) {
        TraceLog(4,"AUTOMATION: Events read from file [%i] do not mach event count specified [%i]",
                 (ulong)uVar3);
        list.count = uVar3;
      }
      fclose(__stream);
      TraceLog(3,"AUTOMATION: Events file loaded successfully");
    }
    TraceLog(3,"AUTOMATION: Events loaded from file: %i",(ulong)list.count);
  }
  AVar1.count = list.count;
  AVar1.capacity = list.capacity;
  AVar1.events = list.events;
  return AVar1;
}

Assistant:

AutomationEventList LoadAutomationEventList(const char *fileName)
{
    AutomationEventList list = { 0 };

    // Allocate and empty automation event list, ready to record new events
    list.events = (AutomationEvent *)RL_CALLOC(MAX_AUTOMATION_EVENTS, sizeof(AutomationEvent));
    list.capacity = MAX_AUTOMATION_EVENTS;

#if defined(SUPPORT_AUTOMATION_EVENTS)
    if (fileName == NULL) TRACELOG(LOG_INFO, "AUTOMATION: New empty events list loaded successfully");
    else
    {
        // Load automation events file (binary)
        /*
        //int dataSize = 0;
        //unsigned char *data = LoadFileData(fileName, &dataSize);

        FILE *raeFile = fopen(fileName, "rb");
        unsigned char fileId[4] = { 0 };

        fread(fileId, 1, 4, raeFile);

        if ((fileId[0] == 'r') && (fileId[1] == 'A') && (fileId[2] == 'E') && (fileId[1] == ' '))
        {
            fread(&eventCount, sizeof(int), 1, raeFile);
            TRACELOG(LOG_WARNING, "Events loaded: %i\n", eventCount);
            fread(events, sizeof(AutomationEvent), eventCount, raeFile);
        }

        fclose(raeFile);
        */

        // Load events file (text)
        //unsigned char *buffer = LoadFileText(fileName);
        FILE *raeFile = fopen(fileName, "rt");

        if (raeFile != NULL)
        {
            unsigned int counter = 0;
            char buffer[256] = { 0 };
            char eventDesc[64] = { 0 };

            fgets(buffer, 256, raeFile);

            while (!feof(raeFile))
            {
                switch (buffer[0])
                {
                    case 'c': sscanf(buffer, "c %i", &list.count); break;
                    case 'e':
                    {
                        sscanf(buffer, "e %d %d %d %d %d %d %[^\n]s", &list.events[counter].frame, &list.events[counter].type,
                               &list.events[counter].params[0], &list.events[counter].params[1], &list.events[counter].params[2], &list.events[counter].params[3], eventDesc);

                        counter++;
                    } break;
                    default: break;
                }

                fgets(buffer, 256, raeFile);
            }

            if (counter != list.count)
            {
                TRACELOG(LOG_WARNING, "AUTOMATION: Events read from file [%i] do not mach event count specified [%i]", counter, list.count);
                list.count = counter;
            }

            fclose(raeFile);

            TRACELOG(LOG_INFO, "AUTOMATION: Events file loaded successfully");
        }

        TRACELOG(LOG_INFO, "AUTOMATION: Events loaded from file: %i", list.count);
    }
#endif
    return list;
}